

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O2

void flatbuffers::IterateObject(uint8_t *obj,TypeTable *type_table,IterationVisitor *visitor)

{
  uint *puVar1;
  TypeCode TVar2;
  voffset_t field;
  TypeTable *type_table_00;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  size_t j;
  ulong uVar7;
  uint *val;
  ElementaryType type;
  uint *local_68;
  uint *local_58;
  long local_50;
  long local_40;
  
  (**visitor->_vptr_IterationVisitor)(visitor);
  local_50 = 0;
  local_40 = 0;
  local_58 = (uint *)0x0;
  for (uVar5 = 0; uVar5 < type_table->num_elems; uVar5 = uVar5 + 1) {
    TVar2 = type_table->type_codes[uVar5];
    if ((short)((uint)(int)(short)TVar2 >> 5) < 0) {
      type_table_00 = (TypeTable *)0x0;
    }
    else {
      type_table_00 = (*type_table->type_refs[(uint)(int)(short)TVar2 >> 5 & 0xffff])();
    }
    if (type_table->names == (char **)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = type_table->names[uVar5];
    }
    if (type_table->st == ST_TABLE) {
      field = FieldIndexToOffset((voffset_t)uVar5);
      local_68 = (uint *)Table::GetAddressOf((Table *)obj,field);
    }
    else {
      local_68 = (uint *)(obj + type_table->values[uVar5]);
    }
    type = (ushort)TVar2 & (ET_STRING|ET_UCHAR);
    (*visitor->_vptr_IterationVisitor[2])
              (visitor,uVar5,local_40,(ulong)type,(ulong)(((ushort)TVar2 & 0x10) >> 4),type_table_00
               ,pcVar6,local_68);
    if (local_68 == (uint *)0x0) {
      local_68 = (uint *)0x0;
    }
    else {
      local_40 = local_40 + 1;
      if (((ushort)TVar2 & 0x10) == 0) {
        IterateValue(type,(uint8_t *)local_68,type_table_00,(uint8_t *)local_58,-1,visitor);
      }
      else {
        if (type_table->st == ST_TABLE) {
          puVar1 = (uint *)((long)local_68 + (ulong)*local_68);
          val = puVar1 + 1;
          local_68 = (uint *)((ulong)*local_68 + (long)local_68);
          uVar4 = (ulong)*puVar1;
        }
        else {
          uVar4 = (ulong)type_table->array_sizes[local_50];
          local_50 = local_50 + 1;
          val = local_68;
        }
        (*visitor->_vptr_IterationVisitor[0x11])(visitor);
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          (*visitor->_vptr_IterationVisitor[0x13])(visitor,uVar7,(ulong)type,type_table_00,val);
          IterateValue(type,(uint8_t *)val,type_table_00,(uint8_t *)local_58,(soffset_t)uVar7,
                       visitor);
          sVar3 = InlineSize(type,type_table_00);
          val = (uint *)((long)val + sVar3);
        }
        (*visitor->_vptr_IterationVisitor[0x12])(visitor);
      }
    }
    local_58 = local_68;
  }
  (*visitor->_vptr_IterationVisitor[1])(visitor);
  return;
}

Assistant:

inline void IterateObject(const uint8_t *obj, const TypeTable *type_table,
                          IterationVisitor *visitor) {
  visitor->StartSequence();
  const uint8_t *prev_val = nullptr;
  size_t set_idx = 0;
  size_t array_idx = 0;
  for (size_t i = 0; i < type_table->num_elems; i++) {
    auto type_code = type_table->type_codes[i];
    auto type = static_cast<ElementaryType>(type_code.base_type);
    auto is_repeating = type_code.is_repeating != 0;
    auto ref_idx = type_code.sequence_ref;
    const TypeTable *ref = nullptr;
    if (ref_idx >= 0) { ref = type_table->type_refs[ref_idx](); }
    auto name = type_table->names ? type_table->names[i] : nullptr;
    const uint8_t *val = nullptr;
    if (type_table->st == ST_TABLE) {
      val = reinterpret_cast<const Table *>(obj)->GetAddressOf(
          FieldIndexToOffset(static_cast<voffset_t>(i)));
    } else {
      val = obj + type_table->values[i];
    }
    visitor->Field(i, set_idx, type, is_repeating, ref, name, val);
    if (val) {
      set_idx++;
      if (is_repeating) {
        auto elem_ptr = val;
        size_t size = 0;
        if (type_table->st == ST_TABLE) {
          // variable length vector
          val += ReadScalar<uoffset_t>(val);
          auto vec = reinterpret_cast<const Vector<uint8_t> *>(val);
          elem_ptr = vec->Data();
          size = vec->size();
        } else {
          // otherwise fixed size array
          size = type_table->array_sizes[array_idx];
          ++array_idx;
        }
        visitor->StartVector();
        for (size_t j = 0; j < size; j++) {
          visitor->Element(j, type, ref, elem_ptr);
          IterateValue(type, elem_ptr, ref, prev_val, static_cast<soffset_t>(j),
                       visitor);
          elem_ptr += InlineSize(type, ref);
        }
        visitor->EndVector();
      } else {
        IterateValue(type, val, ref, prev_val, -1, visitor);
      }
    }
    prev_val = val;
  }
  visitor->EndSequence();
}